

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalBenchmarks.hpp
# Opt level: O2

void benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::CreateEmpty
               (BenchmarkContext *context)

{
  int64_t size;
  StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
  s;
  allocator local_51;
  anon_class_8_1_54a39813 local_50;
  string local_48;
  StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
  local_28;
  
  size = context->_iterationsCount;
  StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
  ::StorageArray(&local_28,size);
  std::__cxx11::string::string((string *)&local_48,"create",&local_51);
  local_50.s = &local_28;
  BenchmarkContext::
  Profile<benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::CreateEmpty(benchmarks::BenchmarkContext&)::_lambda()_1_>
            (context,&local_48,size,&local_50);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"signal",(allocator *)&local_50);
  (*context->_vptr_BenchmarkContext[2])(context,&local_48,size);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"destroy",&local_51);
  local_50.s = &local_28;
  BenchmarkContext::
  Profile<benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::CreateEmpty(benchmarks::BenchmarkContext&)::_lambda()_2_>
            (context,&local_48,size,&local_50);
  std::__cxx11::string::~string((string *)&local_48);
  StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
  ::~StorageArray(&local_28);
  return;
}

Assistant:

static void CreateEmpty(BenchmarkContext& context)
        {
            const auto n = context.GetIterationsCount();

            StorageArray<SignalType> s(n);

            context.Profile("create", n, [&]{ s.Construct(); });
            context.MeasureMemory("signal", n);
            context.Profile("destroy", n, [&]{ s.Destruct(); });
        }